

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void action_poison(tgestate_t *state)

{
  item_t item;
  byte bVar1;
  
  item = state->items_held[0];
  if (((item == '\a') || (state->items_held[1] == '\a')) &&
     (bVar1 = state->item_structs[7].item_and_flags, (bVar1 & 0x20) == 0)) {
    state->item_structs[7].item_and_flags = bVar1 | 0x20;
    state->item_attributes[7] = 'C';
    draw_item(state,item,0x1087);
    draw_item(state,state->items_held[1],0x108a);
    bVar1 = 0x66;
    if (state->morale < 0x66) {
      bVar1 = state->morale;
    }
    state->morale = bVar1 + 10;
    increase_score(state,'2');
    return;
  }
  return;
}

Assistant:

void action_poison(tgestate_t *state)
{
  assert(state != NULL);

  if (state->items_held[0] != item_FOOD &&
      state->items_held[1] != item_FOOD)
    return; /* Have no poison. */

  if (state->item_structs[item_FOOD].item_and_flags & itemstruct_ITEM_FLAG_POISONED)
    return; /* Food is already poisoned. */

  state->item_structs[item_FOOD].item_and_flags |= itemstruct_ITEM_FLAG_POISONED;

  state->item_attributes[item_FOOD] = attribute_BRIGHT_PURPLE_OVER_BLACK;

  draw_all_items(state);

  increase_morale_by_10_score_by_50(state);
}